

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

QList<QLoggingRule> * __thiscall
QList<QLoggingRule>::operator+=(QList<QLoggingRule> *this,QList<QLoggingRule> *l)

{
  QList<QLoggingRule> *in_RDI;
  QList<QLoggingRule> *unaff_retaddr;
  
  append(unaff_retaddr,in_RDI);
  return in_RDI;
}

Assistant:

QList<T> &operator+=(QList<T> &&l) { append(std::move(l)); return *this; }